

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileImporter::createVertexArray
          (ObjFileImporter *this,Model *pModel,Object *pCurrentObject,uint uiMeshIndex,aiMesh *pMesh
          ,uint numIndices)

{
  size_t __n;
  float fVar1;
  aiVector3D *paVar2;
  aiFace *paVar3;
  float fVar4;
  aiVector3D *paVar5;
  aiColor4D *paVar6;
  pointer paVar7;
  undefined7 uVar12;
  reference pvVar8;
  long lVar9;
  size_type sVar10;
  DeadlyImportError *pDVar11;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Model *pMVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  Mesh *pMVar21;
  size_t i;
  allocator<char> local_a9;
  int *local_a8;
  ulong local_a0;
  ulong local_98;
  uint local_90;
  uint local_8c;
  Model *local_88;
  ulong local_80;
  Mesh *local_78;
  string local_70;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  if (pCurrentObject == (Object *)0x0) {
    __assert_fail("__null != pCurrentObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x19a,
                  "void Assimp::ObjFileImporter::createVertexArray(const ObjFile::Model *, const ObjFile::Object *, unsigned int, aiMesh *, unsigned int)"
                 );
  }
  if ((((pCurrentObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pCurrentObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish) &&
      (local_78 = (pModel->m_Meshes).
                  super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uiMeshIndex], local_78 != (Mesh *)0x0))
     && (local_78->m_uiNumIndices != 0)) {
    pMesh->mNumVertices = numIndices;
    if (numIndices == 0) {
      pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"OBJ: no vertices",&local_a9);
      DeadlyImportError::DeadlyImportError(pDVar11,&local_70);
      __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_88 = pModel;
    if ((int)numIndices < 0) {
      pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"OBJ: Too many vertices",&local_a9);
      DeadlyImportError::DeadlyImportError(pDVar11,&local_70);
      __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar17 = (ulong)numIndices * 0xc;
    paVar5 = (aiVector3D *)operator_new__(uVar17);
    __n = uVar17 - (uVar17 - 0xc) % 0xc;
    memset(paVar5,0,__n);
    pMesh->mVertices = paVar5;
    if (((local_88->m_Normals).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (local_88->m_Normals).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish) && (local_78->m_hasNormals == true)) {
      paVar5 = (aiVector3D *)operator_new__(uVar17);
      memset(paVar5,0,__n);
      pMesh->mNormals = paVar5;
    }
    if ((local_88->m_VertexColors).
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_88->m_VertexColors).
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar18 = (ulong)numIndices << 4;
      paVar6 = (aiColor4D *)operator_new__(uVar18);
      memset(paVar6,0,uVar18);
      pMesh->mColors[0] = paVar6;
    }
    pMVar21 = local_78;
    paVar7 = (local_88->m_TextureCoord).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((paVar7 != (local_88->m_TextureCoord).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
       (local_78->m_uiUVCoordinates[0] != 0)) {
      pMesh->mNumUVComponents[0] = local_88->m_TextureCoordDim;
      paVar5 = (aiVector3D *)operator_new__(uVar17);
      paVar7 = (pointer)memset(paVar5,0,__n);
      pMesh->mTextureCoords[0] = paVar5;
    }
    uVar12 = (undefined7)((ulong)paVar7 >> 8);
    local_8c = (uint)CONCAT71(uVar12,1);
    uVar17 = 0;
    uVar15 = 0;
    local_90 = (uint)CONCAT71(uVar12,1);
    uVar18 = 0;
    pMVar16 = local_88;
    while (lVar9 = *(long *)&(pMVar21->m_Faces).
                             super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                             ._M_impl.super__Vector_impl_data,
          uVar18 < (ulong)((long)*(pointer *)
                                  ((long)&(pMVar21->m_Faces).
                                          super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                          ._M_impl + 8) - lVar9 >> 3)) {
      local_a8 = *(int **)(lVar9 + uVar18 * 8);
      local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 2);
      local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 8);
      local_48 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 0xe);
      local_a0 = 0;
      sVar10 = 0;
      local_50 = uVar18;
      while (uVar14 = (uint)uVar15,
            sVar10 < (ulong)(*(long *)(local_a8 + 4) - *(long *)(local_a8 + 2) >> 2)) {
        local_98 = sVar10;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_38,sVar10);
        uVar18 = (ulong)*pvVar8;
        paVar7 = (pMVar16->m_Vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = (long)(pMVar16->m_Vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)paVar7;
        lVar13 = lVar9 % 0xc;
        if ((ulong)(lVar9 / 0xc) <= uVar18) {
          pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10,uVar18,lVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"OBJ: vertex index out of range",&local_a9);
          DeadlyImportError::DeadlyImportError(pDVar11,&local_70);
          __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (pMesh->mNumVertices <= uVar14) {
          pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10,uVar18,lVar13);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"OBJ: bad vertex index",&local_a9);
          DeadlyImportError::DeadlyImportError(pDVar11,&local_70);
          __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        paVar5 = pMesh->mVertices;
        paVar5[uVar15].z = paVar7[uVar18].z;
        fVar1 = paVar7[uVar18].y;
        paVar5 = paVar5 + uVar15;
        paVar5->x = paVar7[uVar18].x;
        paVar5->y = fVar1;
        local_80 = uVar17;
        if ((((local_90 & 1) != 0) &&
            ((pMVar16->m_Normals).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar16->m_Normals).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish)) &&
           (local_98 < (ulong)(*(long *)(local_a8 + 10) - *(long *)(local_a8 + 8) >> 2))) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_40,local_98);
          uVar17 = (ulong)*pvVar8;
          paVar7 = (pMVar16->m_Normals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (uVar17 < (ulong)(((long)(pMVar16->m_Normals).
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7) /
                              0xc)) {
            paVar5 = pMesh->mNormals;
            paVar5[uVar15].z = paVar7[uVar17].z;
            fVar1 = paVar7[uVar17].y;
            paVar5 = paVar5 + uVar15;
            paVar5->x = paVar7[uVar17].x;
            paVar5->y = fVar1;
          }
          else {
            local_90 = 0;
          }
        }
        uVar19 = local_80;
        paVar7 = (pMVar16->m_VertexColors).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (paVar7 != (pMVar16->m_VertexColors).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          fVar1 = paVar7[uVar18].z;
          paVar6 = pMesh->mColors[0];
          fVar4 = paVar7[uVar18].y;
          paVar6[uVar15].r = paVar7[uVar18].x;
          paVar6[uVar15].g = fVar4;
          paVar6[uVar15].b = fVar1;
          paVar6[uVar15].a = 1.0;
        }
        if ((((local_8c & 1) != 0) &&
            ((pMVar16->m_TextureCoord).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar16->m_TextureCoord).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish)) &&
           (local_98 < (ulong)(*(long *)(local_a8 + 0x10) - *(long *)(local_a8 + 0xe) >> 2))) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_48,local_98);
          uVar17 = (ulong)*pvVar8;
          paVar7 = (pMVar16->m_TextureCoord).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (uVar17 < (ulong)(((long)(pMVar16->m_TextureCoord).
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7) /
                              0xc)) {
            fVar1 = paVar7[uVar17].z;
            paVar2 = pMesh->mTextureCoords[0];
            fVar4 = paVar7[uVar17].y;
            paVar5 = paVar2 + uVar15;
            paVar5->x = paVar7[uVar17].x;
            paVar5->y = fVar4;
            paVar2[uVar15].z = fVar1;
          }
          else {
            local_8c = 0;
          }
        }
        iVar20 = (int)uVar19;
        uVar19 = uVar19 & 0xffffffff;
        sVar10 = (*(long *)(local_a8 + 4) - *(long *)(local_a8 + 2) >> 2) - 1;
        paVar3 = pMesh->mFaces;
        if ((*local_a8 == 2) && (local_98 == sVar10)) {
LAB_0045279d:
          uVar17 = (ulong)(iVar20 + (uint)(local_98 != sVar10));
          if (local_98 != 0) {
            if (local_98 != sVar10) {
              paVar5 = pMesh->mVertices;
              uVar14 = uVar14 + 1;
              uVar18 = (ulong)uVar14;
              paVar5[uVar18].z = paVar5[uVar15].z;
              fVar1 = paVar5[uVar15].y;
              paVar5[uVar18].x = paVar5[uVar15].x;
              paVar5[uVar18].y = fVar1;
              if ((*(long *)(local_a8 + 8) != *(long *)(local_a8 + 10)) &&
                 ((pMVar16->m_Normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pMVar16->m_Normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish)) {
                paVar5 = pMesh->mNormals;
                paVar5[uVar18].z = paVar5[uVar15].z;
                fVar1 = paVar5[uVar15].y;
                paVar5[uVar18].x = paVar5[uVar15].x;
                paVar5[uVar18].y = fVar1;
              }
              local_80 = uVar17;
              if ((pMVar16->m_TextureCoord).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start !=
                  (pMVar16->m_TextureCoord).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
                local_a0 = uVar18;
                for (uVar17 = 0; uVar14 = aiMesh::GetNumUVChannels(pMesh), uVar17 < uVar14;
                    uVar17 = uVar17 + 1) {
                  paVar5 = pMesh->mTextureCoords[uVar17];
                  paVar5[uVar18].z = paVar5[uVar15].z;
                  fVar1 = paVar5[uVar15].y;
                  paVar5[uVar18].x = paVar5[uVar15].x;
                  paVar5[uVar18].y = fVar1;
                }
                uVar14 = (uint)local_a0;
                pMVar16 = local_88;
                uVar17 = local_80;
              }
            }
            paVar3[uVar19 - 1].mIndices[1] = uVar14;
          }
LAB_00452887:
          local_a0 = 0;
        }
        else {
          paVar3[uVar19].mIndices[local_a0] = uVar14;
          if (*local_a8 == 2) goto LAB_0045279d;
          if (*local_a8 == 1) {
            uVar17 = (ulong)(iVar20 + 1);
            goto LAB_00452887;
          }
          local_a0 = local_a0 + 1;
          uVar17 = (ulong)(iVar20 + (uint)(local_98 == sVar10));
        }
        uVar15 = (ulong)(uVar14 + 1);
        sVar10 = local_98 + 1;
      }
      pMVar21 = local_78;
      uVar18 = local_50 + 1;
    }
    if ((local_90 & 1) == 0) {
      if (pMesh->mNormals != (aiVector3D *)0x0) {
        operator_delete__(pMesh->mNormals);
      }
      pMesh->mNormals = (aiVector3D *)0x0;
    }
    if ((local_8c & 1) == 0) {
      if (pMesh->mTextureCoords[0] != (aiVector3D *)0x0) {
        operator_delete__(pMesh->mTextureCoords[0]);
      }
      pMesh->mTextureCoords[0] = (aiVector3D *)0x0;
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createVertexArray(const ObjFile::Model* pModel,
                                        const ObjFile::Object* pCurrentObject,
                                        unsigned int uiMeshIndex,
                                        aiMesh* pMesh,
                                        unsigned int numIndices) {
    // Checking preconditions
    ai_assert( NULL != pCurrentObject );

    // Break, if no faces are stored in object
    if ( pCurrentObject->m_Meshes.empty() )
        return;

    // Get current mesh
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ uiMeshIndex ];
    if ( NULL == pObjMesh || pObjMesh->m_uiNumIndices < 1 ) {
        return;
    }

    // Copy vertices of this mesh instance
    pMesh->mNumVertices = numIndices;
    if (pMesh->mNumVertices == 0) {
        throw DeadlyImportError( "OBJ: no vertices" );
    } else if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        throw DeadlyImportError( "OBJ: Too many vertices" );
    }
    pMesh->mVertices = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for normal vectors
    if ( !pModel->m_Normals.empty() && pObjMesh->m_hasNormals )
        pMesh->mNormals = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for vertex-color vectors
    if ( !pModel->m_VertexColors.empty() )
        pMesh->mColors[0] = new aiColor4D[ pMesh->mNumVertices ];

    // Allocate buffer for texture coordinates
    if ( !pModel->m_TextureCoord.empty() && pObjMesh->m_uiUVCoordinates[0] )
    {
        pMesh->mNumUVComponents[ 0 ] = pModel->m_TextureCoordDim;
        pMesh->mTextureCoords[ 0 ] = new aiVector3D[ pMesh->mNumVertices ];
    }

    // Copy vertices, normals and textures into aiMesh instance
    bool normalsok = true, uvok = true;
    unsigned int newIndex = 0, outIndex = 0;
    for ( size_t index=0; index < pObjMesh->m_Faces.size(); index++ ) {
        // Get source face
        ObjFile::Face *pSourceFace = pObjMesh->m_Faces[ index ];

        // Copy all index arrays
        for ( size_t vertexIndex = 0, outVertexIndex = 0; vertexIndex < pSourceFace->m_vertices.size(); vertexIndex++ ) {
            const unsigned int vertex = pSourceFace->m_vertices.at( vertexIndex );
            if ( vertex >= pModel->m_Vertices.size() ) {
                throw DeadlyImportError( "OBJ: vertex index out of range" );
            }

            if ( pMesh->mNumVertices <= newIndex ) {
                throw DeadlyImportError("OBJ: bad vertex index");
            }

            pMesh->mVertices[ newIndex ] = pModel->m_Vertices[ vertex ];

            // Copy all normals
            if ( normalsok && !pModel->m_Normals.empty() && vertexIndex < pSourceFace->m_normals.size()) {
                const unsigned int normal = pSourceFace->m_normals.at( vertexIndex );
                if ( normal >= pModel->m_Normals.size() )
                {
                    normalsok = false;
                }
                else
                {
                    pMesh->mNormals[ newIndex ] = pModel->m_Normals[ normal ];
                }
            }

            // Copy all vertex colors
            if ( !pModel->m_VertexColors.empty())
            {
                const aiVector3D& color = pModel->m_VertexColors[ vertex ];
                pMesh->mColors[0][ newIndex ] = aiColor4D(color.x, color.y, color.z, 1.0);
            }

            // Copy all texture coordinates
            if ( uvok && !pModel->m_TextureCoord.empty() && vertexIndex < pSourceFace->m_texturCoords.size())
            {
                const unsigned int tex = pSourceFace->m_texturCoords.at( vertexIndex );

                if ( tex >= pModel->m_TextureCoord.size() )
                {
                    uvok = false;
                }
                else
                {
                    const aiVector3D &coord3d = pModel->m_TextureCoord[ tex ];
                    pMesh->mTextureCoords[ 0 ][ newIndex ] = aiVector3D( coord3d.x, coord3d.y, coord3d.z );
                }
            }

            // Get destination face
            aiFace *pDestFace = &pMesh->mFaces[ outIndex ];

            const bool last = ( vertexIndex == pSourceFace->m_vertices.size() - 1 );
            if (pSourceFace->m_PrimitiveType != aiPrimitiveType_LINE || !last) {
                pDestFace->mIndices[ outVertexIndex ] = newIndex;
                outVertexIndex++;
            }

            if (pSourceFace->m_PrimitiveType == aiPrimitiveType_POINT) {
                outIndex++;
                outVertexIndex = 0;
            } else if (pSourceFace->m_PrimitiveType == aiPrimitiveType_LINE) {
                outVertexIndex = 0;

                if(!last)
                    outIndex++;

                if (vertexIndex) {
                    if(!last) {
                        pMesh->mVertices[ newIndex+1 ] = pMesh->mVertices[ newIndex ];
                        if ( !pSourceFace->m_normals.empty() && !pModel->m_Normals.empty()) {
                            pMesh->mNormals[ newIndex+1 ] = pMesh->mNormals[newIndex ];
                        }
                        if ( !pModel->m_TextureCoord.empty() ) {
                            for ( size_t i=0; i < pMesh->GetNumUVChannels(); i++ ) {
                                pMesh->mTextureCoords[ i ][ newIndex+1 ] = pMesh->mTextureCoords[ i ][ newIndex ];
                            }
                        }
                        ++newIndex;
                    }

                    pDestFace[-1].mIndices[1] = newIndex;
                }
            }
            else if (last) {
                outIndex++;
            }
            ++newIndex;
        }
    }

    if (!normalsok)
    {
        delete [] pMesh->mNormals;
        pMesh->mNormals = nullptr;
    }

    if (!uvok)
    {
        delete [] pMesh->mTextureCoords[0];
        pMesh->mTextureCoords[0] = nullptr;
    }
}